

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cc
# Opt level: O0

void __thiscall avro::Validator::setupOperation(Validator *this,NodePtr *node)

{
  bool bVar1;
  Type TVar2;
  type this_00;
  value_type *__x;
  Validator *in_RSI;
  long in_RDI;
  Validator *unaff_retaddr;
  NodePtr *in_stack_00000008;
  NodePtr actualNode;
  CompoundType *this_01;
  CompoundType local_48 [2];
  NodePtr *in_stack_ffffffffffffffe8;
  long lVar3;
  Type type;
  
  lVar3 = in_RDI;
  this_00 = boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)in_RSI);
  type = (Type)((ulong)lVar3 >> 0x20);
  TVar2 = Node::type(this_00);
  *(Type *)(in_RDI + 0x10) = TVar2;
  if (*(int *)(in_RDI + 0x10) == 0xe) {
    resolveSymbol(in_stack_00000008);
    setupOperation(in_RSI,in_stack_ffffffffffffffe8);
    boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x2c6239);
  }
  else {
    setupFlag(unaff_retaddr,type);
    bVar1 = isPrimitive(*(Type *)(in_RDI + 0x10));
    if (!bVar1) {
      __x = (value_type *)(in_RDI + 0x28);
      this_01 = local_48;
      CompoundType::CompoundType(this_01,(NodePtr *)__x);
      std::vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>::
      push_back((vector<avro::Validator::CompoundType,_std::allocator<avro::Validator::CompoundType>_>
                 *)this_01,__x);
      CompoundType::~CompoundType((CompoundType *)0x2c62b4);
      *(undefined1 *)(in_RDI + 0x18) = 1;
    }
  }
  return;
}

Assistant:

void
Validator::setupOperation(const NodePtr &node)
{
    nextType_ = node->type();

    if(nextType_ == AVRO_SYMBOLIC) {
        NodePtr actualNode = resolveSymbol(node);
        assert(actualNode);
        setupOperation(actualNode);
        return;
    }

    assert(nextType_ < AVRO_SYMBOLIC);

    setupFlag(nextType_);

    if(!isPrimitive(nextType_)) {
        compoundStack_.push_back(CompoundType(node));
        compoundStarted_ = true;
    }
}